

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IterSetOutputs_Col100(Fts5Iter *pIter,Fts5SegIter *pSeg)

{
  int iVar1;
  u8 *puVar2;
  int *piVar3;
  u8 *puVar4;
  int local_4c;
  u8 *puStack_48;
  int iPrevOut;
  u8 *aOut;
  int *aiColEnd;
  int *aiCol;
  int iPrev;
  u8 *pEnd;
  u8 *a;
  Fts5SegIter *pSeg_local;
  Fts5Iter *pIter_local;
  
  if (pSeg->pLeaf->szLeaf < pSeg->iLeafOffset + pSeg->nPos) {
    fts5IterSetOutputs_Col(pIter,pSeg);
  }
  else {
    puVar2 = pSeg->pLeaf->p + pSeg->iLeafOffset;
    iVar1 = pSeg->nPos;
    aiCol._4_4_ = 0;
    aiColEnd = pIter->pColset->aiCol;
    piVar3 = aiColEnd + pIter->pColset->nCol;
    local_4c = 0;
    (pIter->base).iRowid = pSeg->iRowid;
    puStack_48 = (pIter->poslist).p;
    pEnd = puVar2;
    while (pEnd < puVar2 + iVar1) {
      puVar4 = pEnd + 1;
      aiCol._4_4_ = (*pEnd - 2) + aiCol._4_4_;
      while (*aiColEnd < aiCol._4_4_) {
        aiColEnd = aiColEnd + 1;
        if (aiColEnd == piVar3) goto LAB_001dbeb8;
      }
      pEnd = puVar4;
      if (*aiColEnd == aiCol._4_4_) {
        *puStack_48 = ((char)aiCol._4_4_ - (char)local_4c) + '\x02';
        local_4c = aiCol._4_4_;
        puStack_48 = puStack_48 + 1;
      }
    }
LAB_001dbeb8:
    (pIter->base).pData = (pIter->poslist).p;
    (pIter->base).nData = (int)puStack_48 - (int)(pIter->poslist).p;
  }
  return;
}

Assistant:

static void fts5IterSetOutputs_Col100(Fts5Iter *pIter, Fts5SegIter *pSeg){

  assert( pIter->pIndex->pConfig->eDetail==FTS5_DETAIL_COLUMNS );
  assert( pIter->pColset );

  if( pSeg->iLeafOffset+pSeg->nPos>pSeg->pLeaf->szLeaf ){
    fts5IterSetOutputs_Col(pIter, pSeg);
  }else{
    u8 *a = (u8*)&pSeg->pLeaf->p[pSeg->iLeafOffset];
    u8 *pEnd = (u8*)&a[pSeg->nPos]; 
    int iPrev = 0;
    int *aiCol = pIter->pColset->aiCol;
    int *aiColEnd = &aiCol[pIter->pColset->nCol];

    u8 *aOut = pIter->poslist.p;
    int iPrevOut = 0;

    pIter->base.iRowid = pSeg->iRowid;

    while( a<pEnd ){
      iPrev += (int)a++[0] - 2;
      while( *aiCol<iPrev ){
        aiCol++;
        if( aiCol==aiColEnd ) goto setoutputs_col_out;
      }
      if( *aiCol==iPrev ){
        *aOut++ = (u8)((iPrev - iPrevOut) + 2);
        iPrevOut = iPrev;
      }
    }

setoutputs_col_out:
    pIter->base.pData = pIter->poslist.p;
    pIter->base.nData = aOut - pIter->poslist.p;
  }
}